

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoardsuperblockheader.h
# Opt level: O2

void * __thiscall
Hoard::HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>::normalize
          (HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap> *this,void *ptr)

{
  ulong uVar1;
  
  uVar1 = (long)ptr - (long)this->_start;
  if (this->_objectSizeIsPowerOfTwo == true) {
    uVar1 = this->_objectSize - 1 & uVar1;
  }
  else {
    uVar1 = uVar1 % this->_objectSize;
  }
  return (void *)((long)ptr - uVar1);
}

Assistant:

INLINE void * normalize (void * ptr) const {
      assert (isValid());
      auto offset = (size_t) ptr - (size_t) _start;
      void * p;

      // Optimization note: the modulo operation (%) is *really* slow on
      // some architectures (notably x86-64). To reduce its overhead, we
      // optimize for the case when the size request is a power of two,
      // which is often enough to make a difference.

      if (_objectSizeIsPowerOfTwo) {
	p = (void *) ((size_t) ptr - (offset & (_objectSize - 1)));
      } else {
	p = (void *) ((size_t) ptr - (offset % _objectSize));
      }
      return p;
    }